

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::HandleLogicalArgs<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *con,int param_2)

{
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_30,(function<void_(int)> *)(this + 0x20));
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_50,(function<void_(int)> *)&local_30);
  VisitArguments(&con->super_QuadAndLinTerms,(function<void_(int)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return false;
}

Assistant:

bool HandleLogicalArgs(const Con& con, int ) {
    VisitArguments(con, MarkVarIfLogical_);          // Mark as proper vars
    return false;                                    // don't remove immediately
  }